

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O3

void __thiscall
soplex::LPColSetBase<double>::add(LPColSetBase<double> *this,LPColSetBase<double> *newset)

{
  long lVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  int *piVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  int *piVar10;
  int newdim;
  long lVar11;
  long lVar12;
  
  iVar2 = (this->super_SVSetBase<double>).set.thenum;
  lVar12 = (long)iVar2;
  SVSetBase<double>::add<double>(&this->super_SVSetBase<double>,&newset->super_SVSetBase<double>);
  newdim = (this->super_SVSetBase<double>).set.thenum;
  if ((int)((ulong)((long)(this->low).val.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->low).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start) >> 3) < newdim) {
    VectorBase<double>::reDim(&this->low,newdim,true);
    VectorBase<double>::reDim(&this->up,(this->super_SVSetBase<double>).set.thenum,true);
    VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum,true);
    DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.thenum);
    newdim = (this->super_SVSetBase<double>).set.thenum;
  }
  if (iVar2 < newdim) {
    pdVar3 = (newset->low).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (newset->up).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (newset->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (newset->scaleExp).data;
    pdVar7 = (this->low).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->up).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = (this->scaleExp).data;
    lVar11 = 0;
    do {
      pdVar7[lVar12 + lVar11] = pdVar3[lVar11];
      pdVar8[lVar12 + lVar11] = pdVar4[lVar11];
      pdVar9[lVar12 + lVar11] = pdVar5[lVar11];
      piVar10[lVar12 + lVar11] = piVar6[lVar11];
      lVar1 = lVar12 + lVar11;
      lVar11 = lVar11 + 1;
    } while (lVar1 + 1 < (long)(this->super_SVSetBase<double>).set.thenum);
  }
  return;
}

Assistant:

void add(const LPColSetBase<R>& newset)
   {
      int i = num();

      SVSetBase<R>::add(newset);

      if(num() > low.dim())
      {
         low.reDim(num());
         up.reDim(num());
         object.reDim(num());
         scaleExp.reSize(num());
      }

      for(int j = 0; i < num(); ++i, ++j)
      {
         low[i] = newset.lower(j);
         up[i] = newset.upper(j);
         object[i] = newset.maxObj(j);
         scaleExp[i] = newset.scaleExp[j];
      }
   }